

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
::_remove_last(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
               *this,Index lastIndex)

{
  Dictionary *this_00;
  Pos_index *pPVar1;
  size_t *psVar2;
  Column_container *this_01;
  pointer puVar3;
  void *pvVar4;
  pointer puVar5;
  iterator __it;
  iterator iVar6;
  iterator __it_00;
  invalid_argument *this_02;
  pointer puVar7;
  pointer puVar8;
  ID_index pivot;
  uint local_2c;
  key_type local_28;
  Index local_24;
  
  this_01 = &this->matrix_;
  local_24 = lastIndex;
  __it = std::
         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&this_01->_M_h,&local_24);
  local_2c = *(uint *)((long)__it.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
                             ._M_cur + 0x24);
  puVar3 = (this->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3[*(uint *)((long)__it.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
                         ._M_cur + 0x20)] =
       puVar3[*(uint *)((long)__it.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
                              ._M_cur + 0x20)] - 1;
  puVar5 = (this->super_Matrix_dimension_option).dimensions_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar8 = puVar3, puVar3 != puVar5 && (puVar7 = puVar5 + -1, puVar8 = puVar5, *puVar7 == 0)
         )) {
    (this->super_Matrix_dimension_option).dimensions_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar7;
    puVar5 = puVar7;
  }
  (this->super_Matrix_dimension_option).maxDim_ =
       (int)((ulong)((long)puVar8 - (long)puVar3) >> 2) + -1;
  if (*(key_type *)
       ((long)__it.
              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
              ._M_cur + 0x28) != 0xffffffff) {
    local_28 = *(key_type *)
                ((long)__it.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
                       ._M_cur + 0x28);
    iVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&local_28);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    *(undefined4 *)
     ((long)iVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
            ._M_cur + 0x28) = 0xffffffff;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->pivotToColumnIndex_)._M_h,&local_2c);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&this_01->_M_h,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>,_false>
          ._M_cur);
  this->nextIndex_ = this->nextIndex_ - 1;
  this_00 = &(this->super_Chain_pairing_option).indexToBar_;
  pPVar1 = &(this->super_Chain_pairing_option).nextPosition_;
  *pPVar1 = *pPVar1 - 1;
  __it_00 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&(this->super_Chain_pairing_option).nextPosition_);
  pvVar4 = *(void **)((long)__it_00.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                            ._M_cur + 0x10);
  if (*(int *)((long)pvVar4 + 0x18) == -1) {
    psVar2 = &(this->super_Chain_pairing_option).barcode_.
              super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar4,0x20);
  }
  else {
    *(undefined4 *)((long)pvVar4 + 0x18) = 0xffffffff;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&this_00->_M_h,
          (const_iterator)
          __it_00.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
          ._M_cur);
  if (*(size_t *)
       ((long)&(((this->super_Matrix_row_access_option).rows_)->
               super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[local_2c]._M_t._M_impl.
               super__Rb_tree_header + 0x20) == 0) {
    return;
  }
  this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_02,
             "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."
            );
  __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline void Chain_matrix<Master_matrix>::_remove_last(Index lastIndex)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'_remove_last' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container || !Master_matrix::Option_list::has_vine_update,
                "'_remove_last' is not implemented for the chosen options.");

  ID_index pivot;

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto itToErase = matrix_.find(lastIndex);
    Column& colToErase = itToErase->second;
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_.erase(pivot);
    matrix_.erase(itToErase);
  } else {
    GUDHI_CHECK(lastIndex == nextIndex_ - 1 && nextIndex_ == matrix_.size(),
                std::logic_error("Chain_matrix::_remove_last - Indexation problem."));

    Column& colToErase = matrix_[lastIndex];
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_[pivot] = Master_matrix::template get_null_value<Index>();
    matrix_.pop_back();
    // TODO: resize matrix_ when a lot is removed? Could be not the best strategy if user inserts a lot back afterwards.
  }

  if constexpr (!Master_matrix::Option_list::has_vine_update) {
    --nextIndex_;  // should not be updated when there are vine updates, as possibly lastIndex != nextIndex - 1
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    auto it = _indexToBar().find(--_nextPosition());
    typename Barcode::iterator bar = it->second;

    if (bar->death == Master_matrix::template get_null_value<Pos_index>())
      _barcode().erase(bar);
    else
      bar->death = Master_matrix::template get_null_value<Pos_index>();

    _indexToBar().erase(it);
    if constexpr (Master_matrix::Option_list::has_vine_update) Swap_opt::CP::pivotToPosition_.erase(pivot);
  }

  if constexpr (Master_matrix::Option_list::has_row_access) {
    GUDHI_CHECK(
        RA_opt::get_row(pivot).size() == 0,
        std::invalid_argument(
            "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."));
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      RA_opt::erase_empty_row(pivot);
    }
  }
}